

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBucket::Sweep(LargeHeapBucket *this,RecyclerSweep *recyclerSweep)

{
  LargeHeapBlock *heapBlockList;
  LargeHeapBlock *heapBlockList_00;
  LargeHeapBlock *heapBlockList_01;
  LargeHeapBlock *heapBlockList_02;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  ConfigFlagsTable *pCVar6;
  LargeHeapBlock *currentDisposeLargeBlockList;
  LargeHeapBlock *currentFullLargeObjectBlocks;
  LargeHeapBlock *currentLargePageHeapObjectBlocks;
  LargeHeapBlock *currentLargeObjectBlocks;
  RecyclerSweep *recyclerSweep_local;
  LargeHeapBucket *this_local;
  
  pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
  BVar3 = Recycler::IsConcurrentExecutingState(pRVar4);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x251,"(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState())",
                       "!recyclerSweep.GetRecycler()->IsConcurrentExecutingState()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  heapBlockList = this->largeBlockList;
  heapBlockList_00 = this->largePageHeapBlockList;
  heapBlockList_01 = this->fullLargeBlockList;
  heapBlockList_02 = this->pendingDisposeLargeBlockList;
  this->largeBlockList = (LargeHeapBlock *)0x0;
  this->largePageHeapBlockList = (LargeHeapBlock *)0x0;
  this->fullLargeBlockList = (LargeHeapBlock *)0x0;
  if ((this->supportFreeList & 1U) == 0) goto LAB_0096e808;
  pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
  pCVar6 = Recycler::GetRecyclerFlagsTable(pRVar4);
  if ((pCVar6->Verbose & 1U) != 0) {
    pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
    pCVar6 = Recycler::GetRecyclerFlagsTable(pRVar4);
    bVar2 = Js::Phases::IsEnabled(&pCVar6->Trace,MemoryAllocationPhase);
    if (!bVar2) {
      pRVar4 = RecyclerSweep::GetRecycler(recyclerSweep);
      pCVar6 = Recycler::GetRecyclerFlagsTable(pRVar4);
      bVar2 = Js::Phases::IsEnabled(&pCVar6->Trace,LargeMemoryAllocationPhase);
      if (!bVar2) goto LAB_0096e7f4;
    }
    Output::Print(L"Resetting free list for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat);
  }
LAB_0096e7f4:
  this->freeList = (LargeHeapBlockFreeList *)0x0;
  this->explicitFreeList = (FreeObject *)0x0;
LAB_0096e808:
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x26d,"(this->pendingSweepLargeBlockList == nullptr)",
                       "this->pendingSweepLargeBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_00);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_01);
  SweepLargeHeapBlockList(this,recyclerSweep,heapBlockList_02);
  return;
}

Assistant:

void
LargeHeapBucket::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_CONCURRENT_GC
    // CONCURRENT-TODO: large buckets are not swept in the background currently.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState() && !recyclerSweep.GetRecycler()->IsConcurrentSweepState());
#else
    Assert(!recyclerSweep.GetRecycler()->IsConcurrentExecutingState());
#endif
#endif

    LargeHeapBlock * currentLargeObjectBlocks = largeBlockList;
#ifdef RECYCLER_PAGE_HEAP
    LargeHeapBlock * currentLargePageHeapObjectBlocks = largePageHeapBlockList;
#endif
    LargeHeapBlock * currentFullLargeObjectBlocks = fullLargeBlockList;
    LargeHeapBlock * currentDisposeLargeBlockList = pendingDisposeLargeBlockList;
    this->largeBlockList = nullptr;
#ifdef RECYCLER_PAGE_HEAP
    this->largePageHeapBlockList = nullptr;
#endif
    this->fullLargeBlockList = nullptr;

    // Clear the free list before sweep
    // We'll reconstruct the free list during sweep
    if (this->supportFreeList)
    {
#if DBG
        LargeAllocationVerboseTrace(recyclerSweep.GetRecycler()->GetRecyclerFlagsTable(), _u("Resetting free list for 0x%x bucket\n"), this->sizeCat);
#endif
        this->freeList = nullptr;
        this->explicitFreeList = nullptr;
    }

#if ENABLE_CONCURRENT_GC
    Assert(this->pendingSweepLargeBlockList == nullptr);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentLargeObjectBlocks);
#ifdef RECYCLER_PAGE_HEAP
    SweepLargeHeapBlockList(recyclerSweep, currentLargePageHeapObjectBlocks);
#endif
    SweepLargeHeapBlockList(recyclerSweep, currentFullLargeObjectBlocks);
    SweepLargeHeapBlockList(recyclerSweep, currentDisposeLargeBlockList);
}